

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fixture.c
# Opt level: O1

REF_STATUS ref_fixture_te2_grid(REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi)

{
  REF_GRID_conflict pRVar1;
  REF_NODE ref_node;
  REF_DBL *pRVar2;
  REF_DBL *pRVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined8 uVar8;
  int iVar9;
  REF_INT RVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  char *pcVar14;
  REF_INT cell;
  REF_INT local [27];
  REF_INT local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84 [21];
  
  uVar4 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar4 != 0) {
    pcVar14 = "create";
    uVar8 = 0xe2;
    goto LAB_00116387;
  }
  pRVar1 = *ref_grid_ptr;
  ref_node = pRVar1->node;
  iVar6 = ref_mpi->n;
  iVar7 = ref_mpi->id;
  iVar9 = 0;
  iVar5 = (int)(9 / (long)iVar6);
  iVar12 = iVar5 * iVar6;
  if (9 < iVar12) {
    iVar9 = ((((iVar6 + 9) / iVar6) * (iVar12 + -10)) / iVar5 - iVar12) + 10;
  }
  if (iVar7 == iVar9) {
LAB_00116544:
    uVar4 = ref_node_add(ref_node,0,&local_a8);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x103,"ref_fixture_te2_grid",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar2 = ref_node->real;
    lVar13 = (long)local_a8;
    pRVar3 = pRVar2 + lVar13 * 0xf;
    *pRVar3 = 0.0;
    pRVar3[1] = 0.0;
    pRVar2[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_a8 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 9) / iVar6;
    if (lVar11 / (long)iVar7 < (long)(ulong)((int)(9 % (long)iVar6) + 1)) {
      lVar11 = -1;
      if ((-1 < local_a8) && (local_a8 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar7);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_a8) && (local_a8 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(9 / (long)iVar6);
      iVar6 = 10 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar11 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,1,&local_a4);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x104,"ref_fixture_te2_grid",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar13 = (long)local_a4;
    pRVar3[lVar13 * 0xf] = 1.0;
    pRVar3 = pRVar3 + lVar13 * 0xf + 1;
    *pRVar3 = 0.0;
    pRVar3[1] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_a4 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 9) / iVar6;
    if (lVar11 / (long)iVar7 < (long)(ulong)((int)(9 % (long)iVar6) + 1)) {
      lVar11 = -1;
      if ((-1 < local_a4) && (local_a4 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar7);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_a4) && (local_a4 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(9 / (long)iVar6);
      iVar6 = 10 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar11 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,2,&local_a0);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x105,"ref_fixture_te2_grid",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar13 = (long)local_a0;
    pRVar3[lVar13 * 0xf] = 0.0;
    pRVar3[lVar13 * 0xf + 1] = 1.0;
    pRVar3[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_a0 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 9) / iVar6;
    if (lVar11 / (long)iVar7 < (long)(ulong)((int)(9 % (long)iVar6) + 1)) {
      lVar11 = -1;
      if ((-1 < local_a0) && (local_a0 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar7);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_a0) && (local_a0 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(9 / (long)iVar6);
      iVar6 = 10 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar11 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,3,&local_9c);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x106,"ref_fixture_te2_grid",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar2 = ref_node->real;
    lVar13 = (long)local_9c;
    pRVar3 = pRVar2 + lVar13 * 0xf;
    *pRVar3 = 0.0;
    pRVar3[1] = 0.0;
    pRVar2[lVar13 * 0xf + 2] = 1.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_9c < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 9) / iVar6;
    if (lVar11 / (long)iVar7 < (long)(ulong)((int)(9 % (long)iVar6) + 1)) {
      lVar11 = -1;
      if ((-1 < local_9c) && (local_9c < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar7);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_9c) && (local_9c < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(9 / (long)iVar6);
      iVar6 = 10 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar11 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,4,&local_98);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x107,"ref_fixture_te2_grid",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar13 = (long)local_98;
    pRVar3[lVar13 * 0xf] = 0.5;
    pRVar3 = pRVar3 + lVar13 * 0xf + 1;
    *pRVar3 = 0.0;
    pRVar3[1] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_98 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 9) / iVar6;
    if (lVar11 / (long)iVar7 < (long)(ulong)((int)(9 % (long)iVar6) + 1)) {
      lVar11 = -1;
      if ((-1 < local_98) && (local_98 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar7);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_98) && (local_98 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(9 / (long)iVar6);
      iVar6 = 10 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar11 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,5,&local_94);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x108,"ref_fixture_te2_grid",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar13 = (long)local_94;
    pRVar3[lVar13 * 0xf] = 0.5;
    pRVar3[lVar13 * 0xf + 1] = 0.5;
    pRVar3[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_94 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 9) / iVar6;
    if (lVar11 / (long)iVar7 < (long)(ulong)((int)(9 % (long)iVar6) + 1)) {
      lVar11 = -1;
      if ((-1 < local_94) && (local_94 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar7);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_94) && (local_94 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(9 / (long)iVar6);
      iVar6 = 10 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar11 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,6,&local_90);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x109,"ref_fixture_te2_grid",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar13 = (long)local_90;
    pRVar3[lVar13 * 0xf] = 0.0;
    pRVar3[lVar13 * 0xf + 1] = 0.5;
    pRVar3[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_90 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 9) / iVar6;
    if (lVar11 / (long)iVar7 < (long)(ulong)((int)(9 % (long)iVar6) + 1)) {
      lVar11 = -1;
      if ((-1 < local_90) && (local_90 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar7);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_90) && (local_90 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(9 / (long)iVar6);
      iVar6 = 10 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar11 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,7,&local_8c);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x10a,"ref_fixture_te2_grid",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar2 = ref_node->real;
    lVar13 = (long)local_8c;
    pRVar3 = pRVar2 + lVar13 * 0xf;
    *pRVar3 = 0.0;
    pRVar3[1] = 0.0;
    pRVar2[lVar13 * 0xf + 2] = 0.5;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_8c < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 9) / iVar6;
    if (lVar11 / (long)iVar7 < (long)(ulong)((int)(9 % (long)iVar6) + 1)) {
      lVar11 = -1;
      if ((-1 < local_8c) && (local_8c < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar7);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_8c) && (local_8c < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(9 / (long)iVar6);
      iVar6 = 10 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar11 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,8,&local_88);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x10b,"ref_fixture_te2_grid",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar13 = (long)local_88;
    pRVar3[lVar13 * 0xf] = 0.5;
    pRVar3[lVar13 * 0xf + 1] = 0.0;
    pRVar3[lVar13 * 0xf + 2] = 0.5;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_88 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 9) / iVar6;
    if (lVar11 / (long)iVar7 < (long)(ulong)((int)(9 % (long)iVar6) + 1)) {
      lVar11 = -1;
      if ((-1 < local_88) && (local_88 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar7);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_88) && (local_88 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(9 / (long)iVar6);
      iVar6 = 10 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar11 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,9,local_84);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x10c,"ref_fixture_te2_grid",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar13 = (long)local_84[0];
    pRVar3[lVar13 * 0xf] = 0.0;
    pRVar3[lVar13 * 0xf + 1] = 0.5;
    pRVar3[lVar13 * 0xf + 2] = 0.5;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_84[0] < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 9) / iVar6;
    if (lVar11 / (long)iVar7 < (long)(ulong)((int)(9 % (long)iVar6) + 1)) {
      lVar11 = -1;
      if ((-1 < local_84[0]) && (local_84[0] < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar7);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_84[0]) && (local_84[0] < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(9 / (long)iVar6);
      iVar6 = 10 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar11 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_cell_add(pRVar1->cell[0xc],&local_a8,&local_ac);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x10e,"ref_fixture_te2_grid",(ulong)uVar4,"add tet");
      return uVar4;
    }
  }
  else {
    iVar6 = (iVar6 + 9) / iVar6;
    iVar9 = 0;
    if (iVar6 + 1U < 3) {
      iVar9 = iVar6;
    }
    iVar12 = 10 - iVar12;
    if (iVar12 <= iVar9) {
      iVar9 = (1 - iVar6 * iVar12) / iVar5 + iVar12;
    }
    if (iVar7 == iVar9) goto LAB_00116544;
    iVar9 = (int)(3 / (long)iVar6);
    if (iVar12 <= iVar9) {
      iVar9 = (3 - iVar6 * iVar12) / iVar5 + iVar12;
    }
    if (iVar7 == iVar9) goto LAB_00116544;
    iVar9 = (int)(4 / (long)iVar6);
    if (iVar12 <= iVar9) {
      iVar9 = (4 - iVar6 * iVar12) / iVar5 + iVar12;
    }
    if (iVar7 == iVar9) goto LAB_00116544;
    iVar9 = (int)(5 / (long)iVar6);
    if (iVar12 <= iVar9) {
      iVar9 = (5 - iVar6 * iVar12) / iVar5 + iVar12;
    }
    if (iVar7 == iVar9) goto LAB_00116544;
    iVar9 = (int)(6 / (long)iVar6);
    if (iVar12 <= iVar9) {
      iVar9 = (6 - iVar6 * iVar12) / iVar5 + iVar12;
    }
    if (iVar7 == iVar9) goto LAB_00116544;
    iVar9 = (int)(7 / (long)iVar6);
    if (iVar12 <= iVar9) {
      iVar9 = (7 - iVar6 * iVar12) / iVar5 + iVar12;
    }
    if (iVar7 == iVar9) goto LAB_00116544;
    iVar9 = (int)(8 / (long)iVar6);
    if (iVar12 <= iVar9) {
      iVar9 = (8 - iVar6 * iVar12) / iVar5 + iVar12;
    }
    if (iVar7 == iVar9) goto LAB_00116544;
    iVar9 = (int)(9 / (long)iVar6);
    if (iVar12 <= iVar9) {
      iVar9 = (9 - iVar6 * iVar12) / iVar5 + iVar12;
    }
    if (iVar7 == iVar9) goto LAB_00116544;
  }
  uVar4 = ref_node_initialize_n_global(ref_node,10);
  if (uVar4 == 0) {
    return 0;
  }
  pcVar14 = "init glob";
  uVar8 = 0x111;
LAB_00116387:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",uVar8,
         "ref_fixture_te2_grid",(ulong)uVar4,pcVar14);
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_fixture_te2_grid(REF_GRID *ref_grid_ptr,
                                        REF_MPI ref_mpi) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_INT global[REF_CELL_MAX_SIZE_PER];
  REF_INT local[REF_CELL_MAX_SIZE_PER];
  REF_INT nnodesg = 10;
  REF_INT cell;

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  global[0] = 0;
  global[1] = 1;
  global[2] = 2;
  global[3] = 3;
  global[4] = 4;
  global[5] = 5;
  global[6] = 6;
  global[7] = 7;
  global[8] = 8;
  global[9] = 9;

  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[4]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[5]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[6]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[7]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[8]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[9])) {
    add_that_node(0, 0.0, 0.0, 0.0);
    add_that_node(1, 1.0, 0.0, 0.0);
    add_that_node(2, 0.0, 1.0, 0.0);
    add_that_node(3, 0.0, 0.0, 1.0);
    add_that_node(4, 0.5, 0.0, 0.0);
    add_that_node(5, 0.5, 0.5, 0.0);
    add_that_node(6, 0.0, 0.5, 0.0);
    add_that_node(7, 0.0, 0.0, 0.5);
    add_that_node(8, 0.5, 0.0, 0.5);
    add_that_node(9, 0.0, 0.5, 0.5);

    RSS(ref_cell_add(ref_grid_te2(ref_grid), local, &cell), "add tet");
  }

  RSS(ref_node_initialize_n_global(ref_node, nnodesg), "init glob");

  return REF_SUCCESS;
}